

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O2

Quat<double> * __thiscall Imath_3_2::Quat<double>::operator*=(Quat<double> *this,Quat<double> *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_38;
  double dStack_30;
  double local_28;
  
  dVar1 = this->r;
  dVar2 = q->r;
  dVar11 = Vec3<double>::dot(&this->v,&q->v);
  dVar3 = this->r;
  dVar4 = (q->v).z;
  dVar5 = q->r;
  dVar6 = (this->v).z;
  dVar7 = (q->v).x;
  dVar8 = (q->v).y;
  dVar9 = (this->v).x;
  dVar10 = (this->v).y;
  Vec3<double>::operator%(&this->v,&q->v);
  (this->v).x = dVar5 * dVar9 + dVar3 * dVar7 + local_38;
  (this->v).y = dVar5 * dVar10 + dVar3 * dVar8 + dStack_30;
  (this->v).z = dVar6 * dVar5 + dVar4 * dVar3 + local_28;
  this->r = dVar1 * dVar2 - dVar11;
  return this;
}

Assistant:

const Quat<T>&
Quat<T>::operator*= (const Quat<T>& q) IMATH_NOEXCEPT
{
    T rtmp = r * q.r - (v ^ q.v);
    v      = r * q.v + v * q.r + v % q.v;
    r      = rtmp;
    return *this;
}